

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O3

vtt_block_t * vtt_block_free_head(vtt_block_t *head)

{
  vtt_block_t *pvVar1;
  
  pvVar1 = head->next;
  if (head->cue_id != (char *)0x0) {
    free(head->cue_id);
  }
  if (head->cue_settings != (char *)0x0) {
    free(head->cue_settings);
  }
  free(head);
  return pvVar1;
}

Assistant:

vtt_block_t* vtt_block_free_head(vtt_block_t* head)
{
    vtt_block_t* next = head->next;
    if (head->cue_id != NULL) {
        free(head->cue_id);
    }
    if (head->cue_settings != NULL) {
        free(head->cue_settings);
    }
    free(head);
    return next;
}